

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::BlindTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
          *txin_blind_keys,
          vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>
          *txout_blind_keys,bool is_issuance_blinding)

{
  ByteData *this_00;
  pointer pTVar1;
  TxOutBlindKeys *pTVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  ConfidentialTransaction *pCVar7;
  CfdException *pCVar8;
  TxOutBlindKeys *pTVar9;
  ByteData *__x;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  pointer pTVar10;
  allocator local_1a9;
  ConfidentialTransactionController *local_1a8;
  vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *local_1a0;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  issuance_blinding_keys;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> txin_info_list;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> txout_confidential_keys;
  undefined1 local_150 [32];
  TxInBlindParameters txin_key;
  
  local_1a0 = txout_blind_keys;
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  local_1a8 = __return_storage_ptr__;
  pCVar7 = ConfidentialTransactionController::GetTransaction(__return_storage_ptr__);
  uVar4 = core::ConfidentialTransaction::GetTxInCount(pCVar7);
  pCVar7 = ConfidentialTransactionController::GetTransaction(local_1a8);
  uVar5 = core::ConfidentialTransaction::GetTxOutCount(pCVar7);
  if ((txin_blind_keys->
      super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (txin_blind_keys->
      super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    txin_key.txid._vptr_Txid = (_func_int **)0x4f9d16;
    txin_key.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x132;
    txin_key.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "BlindTransaction";
    core::logger::warn<>((CfdSourceLocation *)&txin_key,"Failed to txins empty.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&txin_key,"JSON value error. Empty txins.",(allocator *)local_150);
    core::CfdException::CfdException(pCVar8,kCfdOutOfRangeError,(string *)&txin_key);
    __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((local_1a0->
      super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>).
      _M_impl.super__Vector_impl_data._M_finish ==
      (local_1a0->
      super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    txin_key.txid._vptr_Txid = (_func_int **)0x4f9d16;
    txin_key.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x137;
    txin_key.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "BlindTransaction";
    core::logger::warn<>((CfdSourceLocation *)&txin_key,"Failed to txouts empty.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&txin_key,"JSON value error. Empty txouts.",(allocator *)local_150);
    core::CfdException::CfdException(pCVar8,kCfdOutOfRangeError,(string *)&txin_key);
    __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
            (&txin_info_list,(ulong)uVar4,(allocator_type *)&txin_key);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&txout_confidential_keys,(ulong)uVar5,(allocator_type *)&txin_key);
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (is_issuance_blinding) {
    std::
    vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
    ::resize(&issuance_blinding_keys,(ulong)uVar4);
  }
  pTVar1 = (txin_blind_keys->
           super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar10 = (txin_blind_keys->
                 super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                 )._M_impl.super__Vector_impl_data._M_start; pTVar10 != pTVar1;
      pTVar10 = pTVar10 + 1) {
    TxInBlindParameters::TxInBlindParameters(&txin_key,pTVar10);
    pCVar7 = ConfidentialTransactionController::GetTransaction(local_1a8);
    uVar6 = (*(pCVar7->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                      (pCVar7,&txin_key,(ulong)txin_key.vout);
    core::ConfidentialAssetId::operator=
              (&txin_info_list.
                super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6].asset,&txin_key.blind_param.asset);
    core::BlindFactor::operator=
              (&txin_info_list.
                super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6].vbf,&txin_key.blind_param.vbf);
    core::BlindFactor::operator=
              (&txin_info_list.
                super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6].abf,&txin_key.blind_param.abf);
    core::ConfidentialValue::operator=
              (&txin_info_list.
                super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6].value,&txin_key.blind_param.value);
    if (txin_key.is_issuance == true) {
      core::Privkey::operator=
                (&issuance_blinding_keys.
                  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].asset_key,
                 &txin_key.issuance_key.asset_key);
      core::Privkey::operator=
                (&issuance_blinding_keys.
                  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].token_key,
                 &txin_key.issuance_key.token_key);
    }
    TxInBlindParameters::~TxInBlindParameters(&txin_key);
  }
  pTVar9 = (local_1a0->
           super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (local_1a0->
           super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &txin_key.txid.data_;
  do {
    if (pTVar9 == pTVar2) {
      ConfidentialTransactionController::BlindTransaction
                (local_1a8,&txin_info_list,&issuance_blinding_keys,&txout_confidential_keys);
      std::
      vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
      ::~vector(&issuance_blinding_keys);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                (&txout_confidential_keys);
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector(&txin_info_list);
      return local_1a8;
    }
    TxOutBlindKeys::TxOutBlindKeys((TxOutBlindKeys *)&txin_key,pTVar9);
    if (uVar5 <= (uint)txin_key.txid._vptr_Txid) {
      local_150._0_8_ = "cfdapi_elements_transaction.cpp";
      local_150._8_4_ = 0x15d;
      local_150._16_8_ = "BlindTransaction";
      core::logger::warn<unsigned_int&>
                ((CfdSourceLocation *)local_150,
                 "Failed to BlindTransaction. Invalid txout index: {}",(uint *)&txin_key);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)local_150,"Invalid txout index.",&local_1a9);
      core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_150);
      __cxa_throw(pCVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    bVar3 = core::Pubkey::IsValid((Pubkey *)this_00);
    if (bVar3) {
      this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                (txout_confidential_keys.
                 super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
                 super__Vector_impl_data._M_start + ((ulong)txin_key.txid._vptr_Txid & 0xffffffff));
      __x = this_00;
LAB_00346a19:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_01,&__x->data_);
    }
    else {
      bVar3 = core::Pubkey::IsValid((Pubkey *)&txin_key.vout);
      if (bVar3) {
        this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  (txout_confidential_keys.
                   super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl
                   .super__Vector_impl_data._M_start +
                  ((ulong)txin_key.txid._vptr_Txid & 0xffffffff));
        __x = (ByteData *)&txin_key.vout;
        goto LAB_00346a19;
      }
    }
    TxOutBlindKeys::~TxOutBlindKeys((TxOutBlindKeys *)&txin_key);
    pTVar9 = pTVar9 + 1;
  } while( true );
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::BlindTransaction(
    const std::string& tx_hex,
    const std::vector<TxInBlindParameters>& txin_blind_keys,
    const std::vector<TxOutBlindKeys>& txout_blind_keys,
    bool is_issuance_blinding) {
  ConfidentialTransactionController txc(tx_hex);

  uint32_t txin_count = txc.GetTransaction().GetTxInCount();
  uint32_t txout_count = txc.GetTransaction().GetTxOutCount();

  if (txin_blind_keys.size() == 0) {
    warn(CFD_LOG_SOURCE, "Failed to txins empty.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "JSON value error. Empty txins.");
  }
  if (txout_blind_keys.size() == 0) {
    warn(CFD_LOG_SOURCE, "Failed to txouts empty.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "JSON value error. Empty txouts.");
  }

  std::vector<BlindParameter> txin_info_list(txin_count);
  std::vector<Pubkey> txout_confidential_keys(txout_count);
  std::vector<IssuanceBlindingKeyPair> issuance_blinding_keys;
  if (is_issuance_blinding) {
    issuance_blinding_keys.resize(txin_count);
  }

  // TxInのBlind情報設定
  for (TxInBlindParameters txin_key : txin_blind_keys) {
    uint32_t index =
        txc.GetTransaction().GetTxInIndex(txin_key.txid, txin_key.vout);
    txin_info_list[index].asset = txin_key.blind_param.asset;
    txin_info_list[index].vbf = txin_key.blind_param.vbf;
    txin_info_list[index].abf = txin_key.blind_param.abf;
    txin_info_list[index].value = txin_key.blind_param.value;
    if (txin_key.is_issuance) {
      issuance_blinding_keys[index].asset_key =
          txin_key.issuance_key.asset_key;
      issuance_blinding_keys[index].token_key =
          txin_key.issuance_key.token_key;
    }
  }

  // TxOutのBlind情報設定
  for (TxOutBlindKeys txout_key : txout_blind_keys) {
    if (txout_key.index < txout_count) {
      if (txout_key.confidential_key.IsValid()) {
        txout_confidential_keys[txout_key.index] = txout_key.confidential_key;
      } else if (txout_key.blinding_key.IsValid()) {
        txout_confidential_keys[txout_key.index] = txout_key.blinding_key;
      }
    } else {
      warn(
          CFD_LOG_SOURCE,
          "Failed to BlindTransaction. Invalid txout index: {}",
          txout_key.index);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid txout index.");
    }
  }

  txc.BlindTransaction(
      txin_info_list, issuance_blinding_keys, txout_confidential_keys);
  return txc;
}